

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockwise.c
# Opt level: O3

void cf_blockwise_accumulate_final
               (uint8_t *partial,size_t *npartial,size_t nblock,void *inp,size_t nbytes,
               cf_blockwise_in_fn process,cf_blockwise_in_fn process_final,void *ctx)

{
  cf_blockwise_in_fn p_Var1;
  ulong __n;
  ulong uVar2;
  size_t sVar3;
  
  if (partial != (uint8_t *)0x0) {
    uVar2 = *npartial;
    __n = nblock - uVar2;
    if ((((uVar2 <= nblock && __n != 0) && (nbytes == 0 || inp != (void *)0x0)) &&
        (process != (cf_blockwise_in_fn)0x0)) && (ctx != (void *)0x0)) {
      if (uVar2 != 0 && nbytes != 0) {
        if (nbytes <= __n) {
          __n = nbytes;
        }
        memcpy(partial + uVar2,inp,__n);
        inp = (void *)((long)inp + __n);
        nbytes = nbytes - __n;
        sVar3 = *npartial;
        *npartial = __n + sVar3;
        if (__n + sVar3 == nblock) {
          p_Var1 = process;
          if (nbytes == 0) {
            p_Var1 = process_final;
          }
          (*p_Var1)(ctx,partial);
          *npartial = 0;
        }
      }
      while (nblock <= nbytes) {
        if (*npartial != 0) goto LAB_0010e60a;
        nbytes = nbytes - nblock;
        p_Var1 = process;
        if (nbytes == 0) {
          p_Var1 = process_final;
        }
        (*p_Var1)(ctx,(uint8_t *)inp);
        inp = (void *)((long)inp + nblock);
      }
      if (nbytes != 0) {
        sVar3 = *npartial;
        do {
          uVar2 = nblock - sVar3;
          if (nbytes <= nblock - sVar3) {
            uVar2 = nbytes;
          }
          memcpy(partial + sVar3,inp,uVar2);
          sVar3 = *npartial + uVar2;
          *npartial = sVar3;
          if (nblock <= sVar3) goto LAB_0010e60a;
          inp = (void *)((long)inp + uVar2);
          nbytes = nbytes - uVar2;
        } while (nbytes != 0);
      }
      return;
    }
  }
LAB_0010e60a:
  abort();
}

Assistant:

void cf_blockwise_accumulate_final(uint8_t *partial, size_t *npartial, size_t nblock,
                                   const void *inp, size_t nbytes,
                                   cf_blockwise_in_fn process,
                                   cf_blockwise_in_fn process_final,
                                   void *ctx)
{
  const uint8_t *bufin = inp;
  assert(partial && *npartial < nblock);
  assert(inp || !nbytes);
  assert(process && ctx);

  /* If we have partial data, copy in to buffer. */
  if (*npartial && nbytes)
  {
    size_t space = nblock - *npartial;
    size_t taken = MIN(space, nbytes);

    memcpy(partial + *npartial, bufin, taken);

    bufin += taken;
    nbytes -= taken;
    *npartial += taken;

    /* If that gives us a full block, process it. */
    if (*npartial == nblock)
    {
      if (nbytes == 0)
        process_final(ctx, partial);
      else
        process(ctx, partial);
      *npartial = 0;
    }
  }

  /* now nbytes < nblock or *npartial == 0. */

  /* If we have a full block of data, process it directly. */
  while (nbytes >= nblock)
  {
    /* Partial buffer must be empty, or we're ignoring extant data */
    assert(*npartial == 0);

    if (nbytes == nblock)
      process_final(ctx, bufin);
    else
      process(ctx, bufin);
    bufin += nblock;
    nbytes -= nblock;
  }

  /* Finally, if we have remaining data, buffer it. */
  while (nbytes)
  {
    size_t space = nblock - *npartial;
    size_t taken = MIN(space, nbytes);

    memcpy(partial + *npartial, bufin, taken);

    bufin += taken;
    nbytes -= taken;
    *npartial += taken;

    /* If we started with *npartial, we must have copied it
     * in first. */
    assert(*npartial < nblock);
  }
}